

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_generator.cc
# Opt level: O3

string * grpc_ts_generator::anon_unknown_0::GenerateNamespace
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *ns,string *filename,bool include_separator)

{
  pointer pcVar1;
  string *extraout_RAX;
  string *psVar2;
  undefined7 in_register_00000009;
  pointer input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if ((int)CONCAT71(in_register_00000009,include_separator) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  input = (ns->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_38 = filename;
  if (input < (ns->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (include_separator) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        flatbuffers::ConvertCase((string *)local_60,input,kDasher,kUpperCamel);
      }
      else {
        pcVar1 = (input->_M_dataplus)._M_p;
        local_60._0_8_ = (string *)(local_60 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,pcVar1,pcVar1 + input->_M_string_length);
        std::__cxx11::string::append((char *)local_60);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_60._0_8_);
      if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      input = input + 1;
    } while (input < (ns->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (include_separator) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    flatbuffers::ConvertCase((string *)local_60,local_38,kDasher,kUpperCamel);
  }
  else {
    local_60._0_8_ = local_60 + 0x10;
    pcVar1 = (local_38->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + local_38->_M_string_length);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_60._0_8_);
  psVar2 = (string *)(local_60 + 0x10);
  if ((string *)local_60._0_8_ != psVar2) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static grpc::string GenerateNamespace(const std::vector<std::string> ns,
                               const std::string filename,
                               const bool include_separator) {
  grpc::string path = "";
  if (include_separator) path += ".";

  for (auto it = ns.begin(); it < ns.end(); it++) {
    if (include_separator) path += "/";
    path += include_separator
                ? flatbuffers::ConvertCase(*it, flatbuffers::Case::kDasher,
                                           flatbuffers::Case::kUpperCamel)
                : *it + "_";
  }

  if (include_separator) path += "/";
  path += include_separator
              ? flatbuffers::ConvertCase(filename, flatbuffers::Case::kDasher,
                                         flatbuffers::Case::kUpperCamel)
              : filename;
  return path;
}